

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O3

LinTerms * __thiscall
mp::BucketAccum1Type<mp::LinTerms>::ExtractSum
          (LinTerms *__return_storage_ptr__,BucketAccum1Type<mp::LinTerms> *this)

{
  size_ty sVar1;
  size_ty *psVar2;
  ulong i;
  size_t i_00;
  LinTerms local_120;
  LinTerms local_a8;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  i = 0;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  psVar2 = &(this->buckets_)._M_elems[1].coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  while (psVar2[-0xf] == 0) {
    i = i + 1;
    psVar2 = psVar2 + 0xf;
    if (i == 0x40) {
      return __return_storage_ptr__;
    }
  }
  ExtractBucket(&local_120,this,i);
  if (&local_120 != __return_storage_ptr__) {
    gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
              ((small_vector_base<std::allocator<double>,_6U> *)__return_storage_ptr__,
               (small_vector_base<std::allocator<double>,_6U> *)&local_120);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              (&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>,
               &local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>);
  }
  if (6 < local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (0x3e < i) {
    return __return_storage_ptr__;
  }
  i_00 = i + 1;
  do {
    if (*psVar2 != 0) {
      sVar1 = (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size;
      if (sVar1 == 0) {
        ExtractBucket(&local_120,this,i_00);
      }
      else {
        ExtractBucket(&local_a8,this,i_00);
        MergeSorted<mp::LinTerms>(&local_120,&local_a8,__return_storage_ptr__);
      }
      if (&local_120 != __return_storage_ptr__) {
        gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                  ((small_vector_base<std::allocator<double>,_6U> *)__return_storage_ptr__,
                   (small_vector_base<std::allocator<double>,_6U> *)&local_120);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>
                   ,&local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>);
      }
      if (6 < local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_120.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_120.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (sVar1 != 0) {
        if (6 < local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
                          .super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
                          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
      }
    }
    i_00 = i_00 + 1;
    psVar2 = psVar2 + 0xf;
  } while (i_00 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

Body BucketAccum1Type<Body>::ExtractSum() {
  Body result;

  size_t i_bucket = 0;
  for ( ; i_bucket<buckets_.size(); ++i_bucket)
    if (HasBucket(i_bucket)) {
      result = ExtractBucket(i_bucket);
      break;
    }

  while ( ++i_bucket<buckets_.size())
    if (HasBucket(i_bucket)) {
      result
          = result.size()
          ? MergeSorted(ExtractBucket(i_bucket), result)
          : ExtractBucket(i_bucket);
    }

  return result;
}